

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::BitpackingInitAnalyze<duckdb::uhugeint_t>(ColumnData *col_data,PhysicalType type)

{
  BitpackingMode BVar1;
  BlockManager *pBVar2;
  DatabaseInstance *db;
  DBConfig *pDVar3;
  BitpackingAnalyzeState<duckdb::uhugeint_t> *pBVar4;
  pointer pBVar5;
  undefined7 in_register_00000031;
  _Head_base<0UL,_duckdb::BitpackingAnalyzeState<duckdb::uhugeint_t>_*,_false> local_40;
  uhugeint_t local_38;
  
  db = ColumnData::GetDatabase((ColumnData *)CONCAT71(in_register_00000031,type));
  pDVar3 = DBConfig::GetConfig(db);
  pBVar2 = ((ColumnData *)CONCAT71(in_register_00000031,type))->block_manager;
  pBVar4 = (BitpackingAnalyzeState<duckdb::uhugeint_t> *)operator_new(0x108b8);
  (pBVar4->super_AnalyzeState).info.block_manager = pBVar2;
  (pBVar4->super_AnalyzeState)._vptr_AnalyzeState = (_func_int **)&PTR__AnalyzeState_0244caf8;
  (pBVar4->state).compression_buffer_idx = 0;
  (pBVar4->state).total_size = 0;
  (pBVar4->state).data_ptr = (void *)0x0;
  (pBVar4->state).mode = AUTO;
  uhugeint_t::uhugeint_t(&local_38,0);
  (pBVar4->state).compression_buffer_internal[0].lower = local_38.lower;
  (pBVar4->state).compression_buffer_internal[0].upper = local_38.upper;
  (pBVar4->state).compression_buffer = (pBVar4->state).compression_buffer_internal + 1;
  BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::Reset(&pBVar4->state);
  BVar1 = (pDVar3->options).force_bitpacking_mode;
  local_40._M_head_impl = pBVar4;
  pBVar5 = unique_ptr<duckdb::BitpackingAnalyzeState<duckdb::uhugeint_t>,_std::default_delete<duckdb::BitpackingAnalyzeState<duckdb::uhugeint_t>_>,_true>
           ::operator->((unique_ptr<duckdb::BitpackingAnalyzeState<duckdb::uhugeint_t>,_std::default_delete<duckdb::BitpackingAnalyzeState<duckdb::uhugeint_t>_>,_true>
                         *)&local_40);
  (pBVar5->state).mode = BVar1;
  col_data->_vptr_ColumnData = (_func_int **)local_40._M_head_impl;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> BitpackingInitAnalyze(ColumnData &col_data, PhysicalType type) {
	auto &config = DBConfig::GetConfig(col_data.GetDatabase());

	CompressionInfo info(col_data.GetBlockManager());
	auto state = make_uniq<BitpackingAnalyzeState<T>>(info);
	state->state.mode = config.options.force_bitpacking_mode;

	return std::move(state);
}